

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O3

bool bssl::tls1_generate_master_secret
               (SSL_HANDSHAKE *hs,Span<unsigned_char> out,Span<const_unsigned_char> premaster)

{
  SSL *pSVar1;
  SSL3_STATE *pSVar2;
  bool bVar3;
  int iVar4;
  EVP_MD *digest;
  char *label;
  size_t label_len;
  uint8_t *out_00;
  uint8_t *seed2;
  size_t seed2_len;
  size_t digests_len;
  uint8_t digests [64];
  
  if (out.size_ != 0x30) {
    abort();
  }
  if ((hs->field_0x6ca & 2) == 0) {
    pSVar1 = hs->ssl;
    digest = SSLTranscript::Digest(&hs->transcript);
    pSVar2 = pSVar1->s3;
    out_00 = pSVar2->client_random;
    seed2 = pSVar2->server_random;
    label = "master secret";
    seed2_len = 0x20;
    digests_len = 0x20;
    label_len = 0xd;
  }
  else {
    out_00 = digests;
    bVar3 = SSLTranscript::GetHash(&hs->transcript,out_00,&digests_len);
    if (!bVar3) {
      return false;
    }
    digest = SSLTranscript::Digest(&hs->transcript);
    seed2 = (uint8_t *)0x0;
    seed2_len = 0;
    label_len = 0x16;
    label = "extended master secret";
  }
  iVar4 = CRYPTO_tls1_prf(digest,out.data_,0x30,premaster.data_,premaster.size_,label,label_len,
                          out_00,digests_len,seed2,seed2_len);
  if (iVar4 != 1) {
    return false;
  }
  return true;
}

Assistant:

bool tls1_generate_master_secret(SSL_HANDSHAKE *hs, Span<uint8_t> out,
                                 Span<const uint8_t> premaster) {
  BSSL_CHECK(out.size() == SSL3_MASTER_SECRET_SIZE);

  const SSL *ssl = hs->ssl;
  if (hs->extended_master_secret) {
    uint8_t digests[EVP_MAX_MD_SIZE];
    size_t digests_len;
    if (!hs->transcript.GetHash(digests, &digests_len) ||
        !tls1_prf(hs->transcript.Digest(), out, premaster,
                  "extended master secret", Span(digests, digests_len), {})) {
      return false;
    }
  } else {
    if (!tls1_prf(hs->transcript.Digest(), out, premaster, "master secret",
                  ssl->s3->client_random, ssl->s3->server_random)) {
      return false;
    }
  }

  return true;
}